

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O3

void Dau_DsdMergeSubstitute_rec
               (Dau_Sto_t *pS,char *pStr,char **p,int *pMatches,int *pStatus,int fWrite)

{
  char **ppcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  char *pcVar6;
  byte bVar7;
  byte *pbVar8;
  ulong uVar9;
  int *piVar10;
  char **ppcVar11;
  uint uVar12;
  long lVar13;
  char (*pacVar14) [2000];
  char *pcVar15;
  char *pcVar16;
  char **ppcVar17;
  char *pcVar18;
  
  pbVar5 = (byte *)*p;
  bVar7 = *pbVar5;
  if (bVar7 == 0x21) {
    pbVar8 = pbVar5;
    if (fWrite != 0) {
      pcVar15 = pS->pPosOutput;
      pS->pPosOutput = pcVar15 + 1;
      *pcVar15 = '!';
      pbVar8 = (byte *)*p;
    }
    pbVar5 = pbVar8 + 1;
    *p = (char *)pbVar5;
    bVar7 = pbVar8[1];
  }
  pbVar8 = pbVar5;
  if ((byte)(bVar7 + 0xbf) < 6 || (byte)(bVar7 - 0x30) < 10) {
    do {
      if (fWrite != 0) {
        pbVar5 = (byte *)pS->pPosOutput;
        pS->pPosOutput = (char *)(pbVar5 + 1);
        *pbVar5 = bVar7;
        pbVar8 = (byte *)*p;
      }
      pbVar5 = pbVar8 + 1;
      *p = (char *)pbVar5;
      bVar7 = pbVar8[1];
      pbVar8 = pbVar5;
    } while ((byte)(bVar7 - 0x30) < 10 || (byte)(bVar7 + 0xbf) < 6);
  }
  pbVar8 = pbVar5;
  if ((bVar7 == 0x3c) &&
     (lVar13 = (long)pMatches[(long)pbVar5 - (long)pStr], pStr[lVar13 + 1] == '{')) {
    pbVar8 = (byte *)(pStr + lVar13 + 1);
    *p = (char *)pbVar8;
    if (fWrite == 0) {
      bVar7 = *pbVar8;
      if ((byte)(bVar7 + 0x9f) < 0x1a) {
        return;
      }
      goto LAB_0051a827;
    }
    if (pbVar5 < pbVar8) {
      pbVar5 = pbVar5 + -1;
      do {
        bVar7 = pbVar5[1];
        pbVar5 = pbVar5 + 1;
        pbVar8 = (byte *)pS->pPosOutput;
        pS->pPosOutput = (char *)(pbVar8 + 1);
        *pbVar8 = bVar7;
      } while (pbVar5 < pStr + lVar13);
      pbVar8 = (byte *)*p;
    }
  }
  bVar7 = *pbVar8;
  if ((byte)(bVar7 + 0x9f) < 0x1a) {
    if (fWrite == 0) {
      return;
    }
    pbVar5 = (byte *)pS->pPosOutput;
    pS->pPosOutput = (char *)(pbVar5 + 1);
    *pbVar5 = bVar7;
    return;
  }
LAB_0051a827:
  uVar12 = (uint)bVar7;
  if (((0x3f < bVar7 - 0x3c) || ((0x8000000080000001U >> ((ulong)(bVar7 - 0x3c) & 0x3f) & 1) == 0))
     && (uVar12 != 0x28)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauMerge.c"
                  ,0x1ec,
                  "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                 );
  }
  if ((bVar7 != 0x28) + uVar12 + 1 != (int)pStr[pMatches[(long)pbVar8 - (long)pStr]]) {
    __assert_fail("*q == **p + 1 + (**p != \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauMerge.c"
                  ,0x19f,
                  "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                 );
  }
  iVar3 = pStatus[(long)pbVar8 - (long)pStr];
  pcVar15 = pStr + pMatches[(long)pbVar8 - (long)pStr];
  if (fWrite == 0) {
    if (iVar3 != 3) {
      __assert_fail("Status == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauMerge.c"
                    ,0x1a2,
                    "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                   );
    }
    *p = pcVar15;
  }
  else if (iVar3 == 0) {
    pbVar5 = (byte *)pS->pPosOutput;
    pS->pPosOutput = (char *)(pbVar5 + 1);
    *pbVar5 = bVar7;
    while( true ) {
      pcVar18 = *p + 1;
      *p = pcVar18;
      if (pcVar15 <= pcVar18) break;
      if (*pcVar18 == '!') {
        pcVar18 = pS->pPosOutput;
        pS->pPosOutput = pcVar18 + 1;
        *pcVar18 = '!';
        *p = *p + 1;
      }
      Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,1);
    }
    cVar2 = *pcVar18;
    pcVar18 = pS->pPosOutput;
    pS->pPosOutput = pcVar18 + 1;
    *pcVar18 = cVar2;
    if (*p != pcVar15) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauMerge.c"
                    ,0x1b4,
                    "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                   );
    }
  }
  else {
    if (iVar3 != 1) {
      if (iVar3 == 3) {
        __assert_fail("Status != 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauMerge.c"
                      ,0x1a6,
                      "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                     );
      }
      if ((bVar7 != 0x7b) && (uVar12 != 0x3c)) {
        if (iVar3 == 2) {
          pbVar5 = (byte *)pS->pPosOutput;
          pS->pPosOutput = (char *)(pbVar5 + 1);
          *pbVar5 = bVar7;
          cVar2 = **p;
          iVar3 = pS->iVarUsed;
          ppcVar17 = pS->pPosStore + iVar3;
          *ppcVar17 = pS->pStore[iVar3];
          if (cVar2 != '\0') {
            *ppcVar17 = pS->pStore[iVar3] + 1;
            pS->pStore[iVar3][0] = cVar2;
          }
          ppcVar1 = &pS->pPosOutput;
          pS->iVarUsed = iVar3 + 1;
          pcVar16 = *p;
          pcVar18 = pcVar16 + 1;
          *p = pcVar18;
          if (pcVar18 < pcVar15) {
            do {
              uVar9 = (ulong)(pcVar16[1] == '!');
              pcVar6 = pcVar18 + (uVar9 - 1);
              piVar10 = pMatches + (long)(pcVar18 + (uVar9 - (long)pStr) + -1);
              do {
                cVar2 = pcVar6[1];
                pcVar6 = pcVar6 + 1;
                piVar10 = piVar10 + 1;
              } while ((byte)(cVar2 - 0x30U) < 10 || (byte)(cVar2 + 0xbfU) < 6);
              if ((cVar2 == '<') && (pStr[(long)*piVar10 + 1] == '{')) {
                pcVar6 = pStr + (long)*piVar10 + 1;
              }
              iVar4 = pStatus[(long)pcVar6 - (long)pStr];
              if (pcVar16[1] == '!') {
                ppcVar11 = ppcVar1;
                if (iVar4 == 3) {
                  ppcVar11 = ppcVar17;
                }
                pcVar18 = *ppcVar11;
                *ppcVar11 = pcVar18 + 1;
                *pcVar18 = '!';
                *p = *p + 1;
                pcVar18 = pcVar16 + 2;
              }
              Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,(uint)(iVar4 != 3));
              pcVar16 = *p;
              if ((iVar4 == 3) && (pcVar18 < pcVar16 + 1)) {
                pcVar18 = pcVar18 + -1;
                do {
                  cVar2 = pcVar18[1];
                  pcVar18 = pcVar18 + 1;
                  pcVar6 = *ppcVar17;
                  *ppcVar17 = pcVar6 + 1;
                  *pcVar6 = cVar2;
                } while (pcVar18 != pcVar16);
                pcVar16 = *p;
              }
              pcVar18 = pcVar16 + 1;
              *p = pcVar18;
            } while (pcVar18 < pcVar15);
          }
          cVar2 = *pcVar15;
          if (cVar2 != '\0') {
            pcVar15 = *ppcVar17;
            *ppcVar17 = pcVar15 + 1;
            *pcVar15 = cVar2;
          }
          pcVar15 = *ppcVar17;
          *ppcVar17 = pcVar15 + 1;
          *pcVar15 = '\0';
          pcVar15 = *ppcVar1;
          *ppcVar1 = pcVar15 + 1;
          *pcVar15 = (char)iVar3 + 'a';
          cVar2 = **p;
          pcVar15 = *ppcVar1;
          *ppcVar1 = pcVar15 + 1;
          *pcVar15 = cVar2;
          return;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauMerge.c"
                      ,0x1e9,
                      "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                     );
      }
    }
    pbVar5 = (byte *)pS->pPosOutput;
    pS->pPosOutput = (char *)(pbVar5 + 1);
    *pbVar5 = bVar7;
    pcVar18 = *p + 1;
    *p = pcVar18;
    if (pcVar18 < pcVar15) {
      do {
        if (*pcVar18 == '!') {
          pcVar18 = pS->pPosOutput;
          pS->pPosOutput = pcVar18 + 1;
          *pcVar18 = '!';
          pcVar16 = *p;
          pcVar18 = pcVar16 + 1;
          *p = pcVar18;
          uVar9 = (ulong)(pcVar16[1] == '!');
        }
        else {
          uVar9 = 0;
        }
        pcVar16 = pcVar18 + -1;
        pcVar6 = pcVar18 + (uVar9 - 1);
        piVar10 = pMatches + (long)(pcVar18 + (uVar9 - (long)pStr) + -1);
        do {
          cVar2 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
          piVar10 = piVar10 + 1;
        } while ((byte)(cVar2 - 0x30U) < 10 || (byte)(cVar2 + 0xbfU) < 6);
        if ((cVar2 == '<') && (pStr[(long)*piVar10 + 1] == '{')) {
          pcVar6 = pStr + (long)*piVar10 + 1;
        }
        iVar3 = pStatus[(long)pcVar6 - (long)pStr];
        Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,(uint)(iVar3 != 3));
        if (iVar3 == 3) {
          pcVar6 = *p;
          iVar3 = pS->iVarUsed;
          pacVar14 = pS->pStore + iVar3;
          pS->pPosStore[iVar3] = *pacVar14;
          pS->iVarUsed = iVar3 + 1;
          if (pcVar18 < pcVar6 + 1) {
            do {
              cVar2 = pcVar16[1];
              pcVar16 = pcVar16 + 1;
              pcVar18 = pS->pPosStore[iVar3];
              pS->pPosStore[iVar3] = pcVar18 + 1;
              *pcVar18 = cVar2;
            } while (pcVar16 != pcVar6);
            pacVar14 = (char (*) [2000])pS->pPosStore[iVar3];
          }
          pS->pPosStore[iVar3] = *pacVar14 + 1;
          (*pacVar14)[0] = '\0';
          pcVar18 = pS->pPosOutput;
          pS->pPosOutput = pcVar18 + 1;
          *pcVar18 = (char)iVar3 + 'a';
        }
        pcVar18 = *p + 1;
        *p = pcVar18;
      } while (pcVar18 < pcVar15);
    }
    cVar2 = *pcVar18;
    pcVar18 = pS->pPosOutput;
    pS->pPosOutput = pcVar18 + 1;
    *pcVar18 = cVar2;
    if (*p != pcVar15) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauMerge.c"
                    ,0x1cb,
                    "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                   );
    }
  }
  return;
}

Assistant:

void Dau_DsdMergeSubstitute_rec( Dau_Sto_t * pS, char * pStr, char ** p, int * pMatches, int * pStatus, int fWrite )
{
//    assert( **p != '!' );

    if ( **p == '!' )
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        (*p)++;
    }

    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        (*p)++;
    }
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[ *p - pStr ];
        if ( *(q+1) == '{' )
        {
            char * pTemp = *p;
            *p = q+1;
            if ( fWrite )
                for ( ; pTemp < q+1; pTemp++ )
                    Dau_DsdMergeStoreAddToOutputChar( pS, *pTemp );
        }
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        return;
    }
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int New, StatusFan, Status = pStatus[*p - pStr];
        char * pBeg, * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        if ( !fWrite )
        {
             assert( Status == 3 );
             *p = q;
             return;
        }
        assert( Status != 3 );
        if ( Status == 0 ) // none pure
        {
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                if ( **p == '!' )
                {
                    Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    (*p)++;
                }
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, 1 );
            }
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            assert( *p == q );
            return;
        }
        if ( Status == 1 || **p == '<' || **p == '{' ) // 1 pure
        {
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                if ( **p == '!' )
                {
                    Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    (*p)++;
                }
                pBeg = *p;
                StatusFan = Dau_DsdMergeGetStatus( pBeg, pStr, pMatches, pStatus );
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, StatusFan != 3 );
                if ( StatusFan == 3 )
                {
                    int New = Dau_DsdMergeStoreCreateDef( pS, pBeg, *p+1 );
                    Dau_DsdMergeStoreAddToOutputChar( pS, (char)('a' + New) );
                }
            }
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            assert( *p == q );
            return;
        }
        if ( Status == 2 )
        {
            // add more than one defs
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            New = Dau_DsdMergeStoreStartDef( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                pBeg = *p;
                StatusFan = Dau_DsdMergeGetStatus( pBeg, pStr, pMatches, pStatus );
                if ( **p == '!' )
                {
                    if ( StatusFan != 3 )
                        Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    else
                        Dau_DsdMergeStoreAddToDefChar( pS, New, '!' );
                    (*p)++;
                    pBeg++;
                }
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, StatusFan != 3 );
                if ( StatusFan == 3 )
                    Dau_DsdMergeStoreAddToDef( pS, New, pBeg, *p+1 );
            }
            Dau_DsdMergeStoreStopDef( pS, New, *q );
            Dau_DsdMergeStoreAddToOutputChar( pS, (char)('a' + New) );
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            return;
        }
        assert( 0 );
        return;
    }
    assert( 0 );
}